

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::operator=(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
            *this,node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                  *other)

{
  slot_type *pptVar1;
  slot_type *pptVar2;
  
  destroy(this);
  if ((other->alloc_).
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged == true) {
    std::optional<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>::value
              (&other->alloc_);
    (this->alloc_).
    super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
    .super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ._M_engaged = true;
    pptVar1 = slot(this);
    pptVar2 = slot(other);
    *pptVar1 = *pptVar2;
    reset(other);
  }
  return this;
}

Assistant:

node_handle_base& operator=(node_handle_base&& other) noexcept {
        destroy();
        if (!other.empty()) {
            if (other.alloc_) {
               alloc_.emplace(other.alloc_.value());
            }
            PolicyTraits::transfer(alloc(), slot(), other.slot());
            other.reset();
        }
        return *this;
    }